

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  element_type *peVar1;
  shared_ptr<Block> local_ae8;
  shared_ptr<Block> local_ad8;
  shared_ptr<Block> local_ac8;
  shared_ptr<Block> local_ab8;
  shared_ptr<Block> local_aa8;
  shared_ptr<Block> local_a98;
  shared_ptr<Block> local_a88;
  shared_ptr<Block> local_a78;
  shared_ptr<Block> local_a68;
  shared_ptr<Block> local_a58;
  shared_ptr<Block> local_a48;
  shared_ptr<Block> local_a38;
  shared_ptr<Block> local_a28;
  shared_ptr<Block> local_a18;
  shared_ptr<Block> local_a08;
  shared_ptr<Block> local_9f8;
  shared_ptr<Block> local_9e8;
  Record local_9d8;
  Record local_9b0;
  Record local_988;
  Record local_960;
  Record local_938;
  Record local_910;
  Record local_8e8;
  Record local_8c0;
  Record local_898;
  Record local_870;
  Record local_848;
  Record local_820;
  Record local_7f8;
  Record local_7d0;
  Record local_7a8;
  Record local_780;
  Record local_758;
  Record local_730;
  undefined4 local_704;
  undefined1 local_700 [8];
  shared_ptr<Block> b10;
  undefined1 local_6e8 [8];
  shared_ptr<Block> b9;
  undefined1 local_6d0 [8];
  shared_ptr<Block> b8;
  undefined1 local_6b8 [8];
  shared_ptr<Block> b7;
  undefined1 local_6a0 [8];
  shared_ptr<Block> b6;
  undefined1 local_688 [8];
  shared_ptr<Block> b5;
  undefined1 local_670 [8];
  shared_ptr<Block> b4;
  undefined1 local_658 [8];
  shared_ptr<Block> b3;
  undefined1 local_640 [8];
  shared_ptr<Block> b2;
  undefined1 local_628 [8];
  shared_ptr<Block> b1;
  string local_610;
  undefined1 local_5f0 [8];
  Record r19;
  string local_5c0;
  undefined1 local_5a0 [8];
  Record r18;
  string local_570;
  undefined1 local_550 [8];
  Record r17;
  string local_520;
  undefined1 local_500 [8];
  Record r16;
  string local_4d0;
  undefined1 local_4b0 [8];
  Record r15;
  string local_480;
  undefined1 local_460 [8];
  Record r14;
  string local_430;
  undefined1 local_410 [8];
  Record r13;
  string local_3e0;
  undefined1 local_3c0 [8];
  Record r12;
  string local_390;
  undefined1 local_370 [8];
  Record r11;
  string local_340;
  undefined1 local_320 [8];
  Record r10;
  string local_2f0;
  undefined1 local_2d0 [8];
  Record r9;
  string local_2a0;
  undefined1 local_280 [8];
  Record r8;
  string local_250;
  undefined1 local_230 [8];
  Record r7;
  string local_200;
  undefined1 local_1e0 [8];
  Record r6;
  string local_1b0;
  undefined1 local_190 [8];
  Record r5;
  string local_160;
  undefined1 local_140 [8];
  Record r4;
  string local_110;
  undefined1 local_f0 [8];
  Record r3;
  string local_c0;
  undefined1 local_a0 [8];
  Record r2;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  Record r1;
  BPlusTree *bplustree;
  
  r1.numVotes._3_1_ = 0;
  BPlusTree::BPlusTree((BPlusTree *)ctx,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"r1",&local_61);
  Record::Record((Record *)local_40,&local_60,1.0,1);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"r2",(allocator *)((long)&r3.numVotes + 3));
  Record::Record((Record *)local_a0,&local_c0,2.0,2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r3.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"r3",(allocator *)((long)&r4.numVotes + 3));
  Record::Record((Record *)local_f0,&local_110,3.0,3);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r4.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"r4",(allocator *)((long)&r5.numVotes + 3));
  Record::Record((Record *)local_140,&local_160,4.0,4);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r5.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"r5",(allocator *)((long)&r6.numVotes + 3));
  Record::Record((Record *)local_190,&local_1b0,5.0,5);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r6.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_200,"r6",(allocator *)((long)&r7.numVotes + 3));
  Record::Record((Record *)local_1e0,&local_200,6.0,6);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r7.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"r7",(allocator *)((long)&r8.numVotes + 3));
  Record::Record((Record *)local_230,&local_250,7.0,7);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r8.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"r8",(allocator *)((long)&r9.numVotes + 3));
  Record::Record((Record *)local_280,&local_2a0,8.0,8);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r9.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f0,"r9",(allocator *)((long)&r10.numVotes + 3));
  Record::Record((Record *)local_2d0,&local_2f0,9.0,9);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r10.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_340,"r10",(allocator *)((long)&r11.numVotes + 3));
  Record::Record((Record *)local_320,&local_340,10.0,10);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r11.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390,"r11",(allocator *)((long)&r12.numVotes + 3));
  Record::Record((Record *)local_370,&local_390,11.0,0xb);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r12.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e0,"r12",(allocator *)((long)&r13.numVotes + 3));
  Record::Record((Record *)local_3c0,&local_3e0,12.0,0xc);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r13.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_430,"r13",(allocator *)((long)&r14.numVotes + 3));
  Record::Record((Record *)local_410,&local_430,13.0,0xd);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r14.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_480,"r14",(allocator *)((long)&r15.numVotes + 3));
  Record::Record((Record *)local_460,&local_480,14.0,0xe);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r15.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d0,"r15",(allocator *)((long)&r16.numVotes + 3));
  Record::Record((Record *)local_4b0,&local_4d0,15.0,0xf);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r16.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_520,"r16",(allocator *)((long)&r17.numVotes + 3));
  Record::Record((Record *)local_500,&local_520,16.0,0x10);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r17.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_570,"r17",(allocator *)((long)&r18.numVotes + 3));
  Record::Record((Record *)local_550,&local_570,17.0,0x11);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r18.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5c0,"r18",(allocator *)((long)&r19.numVotes + 3));
  Record::Record((Record *)local_5a0,&local_5c0,18.0,0x12);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r19.numVotes + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_610,"r19",
             (allocator *)
             ((long)&b1.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 7)
            );
  Record::Record((Record *)local_5f0,&local_610,19.0,0x13);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&b1.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 7)
            );
  b2.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 2;
  std::make_shared<Block,int>((int *)local_628);
  b3.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 2;
  std::make_shared<Block,int>((int *)local_640);
  b4.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 2;
  std::make_shared<Block,int>((int *)local_658);
  b5.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 2;
  std::make_shared<Block,int>((int *)local_670);
  b6.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 2;
  std::make_shared<Block,int>((int *)local_688);
  b7.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 2;
  std::make_shared<Block,int>((int *)local_6a0);
  b8.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 2;
  std::make_shared<Block,int>((int *)local_6b8);
  b9.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 2;
  std::make_shared<Block,int>((int *)local_6d0);
  b10.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 2;
  std::make_shared<Block,int>((int *)local_6e8);
  local_704 = 2;
  std::make_shared<Block,int>((int *)local_700);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_628);
  Record::Record(&local_730,(Record *)local_40);
  Block::addRecord(peVar1,&local_730);
  Record::~Record(&local_730);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_628);
  Record::Record(&local_758,(Record *)local_a0);
  Block::addRecord(peVar1,&local_758);
  Record::~Record(&local_758);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_640);
  Record::Record(&local_780,(Record *)local_f0);
  Block::addRecord(peVar1,&local_780);
  Record::~Record(&local_780);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_640);
  Record::Record(&local_7a8,(Record *)local_140);
  Block::addRecord(peVar1,&local_7a8);
  Record::~Record(&local_7a8);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_658);
  Record::Record(&local_7d0,(Record *)local_190);
  Block::addRecord(peVar1,&local_7d0);
  Record::~Record(&local_7d0);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_658);
  Record::Record(&local_7f8,(Record *)local_1e0);
  Block::addRecord(peVar1,&local_7f8);
  Record::~Record(&local_7f8);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_670);
  Record::Record(&local_820,(Record *)local_230);
  Block::addRecord(peVar1,&local_820);
  Record::~Record(&local_820);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_670);
  Record::Record(&local_848,(Record *)local_280);
  Block::addRecord(peVar1,&local_848);
  Record::~Record(&local_848);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_688);
  Record::Record(&local_870,(Record *)local_2d0);
  Block::addRecord(peVar1,&local_870);
  Record::~Record(&local_870);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_688);
  Record::Record(&local_898,(Record *)local_320);
  Block::addRecord(peVar1,&local_898);
  Record::~Record(&local_898);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_6a0);
  Record::Record(&local_8c0,(Record *)local_370);
  Block::addRecord(peVar1,&local_8c0);
  Record::~Record(&local_8c0);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_6a0);
  Record::Record(&local_8e8,(Record *)local_3c0);
  Block::addRecord(peVar1,&local_8e8);
  Record::~Record(&local_8e8);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_6b8);
  Record::Record(&local_910,(Record *)local_410);
  Block::addRecord(peVar1,&local_910);
  Record::~Record(&local_910);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_6b8);
  Record::Record(&local_938,(Record *)local_460);
  Block::addRecord(peVar1,&local_938);
  Record::~Record(&local_938);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_6d0);
  Record::Record(&local_960,(Record *)local_4b0);
  Block::addRecord(peVar1,&local_960);
  Record::~Record(&local_960);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_6d0);
  Record::Record(&local_988,(Record *)local_500);
  Block::addRecord(peVar1,&local_988);
  Record::~Record(&local_988);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_6e8);
  Record::Record(&local_9b0,(Record *)local_550);
  Block::addRecord(peVar1,&local_9b0);
  Record::~Record(&local_9b0);
  peVar1 = std::__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Block,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_6e8);
  Record::Record(&local_9d8,(Record *)local_5a0);
  Block::addRecord(peVar1,&local_9d8);
  Record::~Record(&local_9d8);
  std::shared_ptr<Block>::shared_ptr(&local_9e8,(shared_ptr<Block> *)local_628);
  BPlusTree::InsertKey((BPlusTree *)ctx,1.0,&local_9e8);
  std::shared_ptr<Block>::~shared_ptr(&local_9e8);
  std::shared_ptr<Block>::shared_ptr(&local_9f8,(shared_ptr<Block> *)local_628);
  BPlusTree::InsertKey((BPlusTree *)ctx,2.0,&local_9f8);
  std::shared_ptr<Block>::~shared_ptr(&local_9f8);
  std::shared_ptr<Block>::shared_ptr(&local_a08,(shared_ptr<Block> *)local_640);
  BPlusTree::InsertKey((BPlusTree *)ctx,3.0,&local_a08);
  std::shared_ptr<Block>::~shared_ptr(&local_a08);
  std::shared_ptr<Block>::shared_ptr(&local_a18,(shared_ptr<Block> *)local_640);
  BPlusTree::InsertKey((BPlusTree *)ctx,4.0,&local_a18);
  std::shared_ptr<Block>::~shared_ptr(&local_a18);
  std::shared_ptr<Block>::shared_ptr(&local_a28,(shared_ptr<Block> *)local_658);
  BPlusTree::InsertKey((BPlusTree *)ctx,5.0,&local_a28);
  std::shared_ptr<Block>::~shared_ptr(&local_a28);
  std::shared_ptr<Block>::shared_ptr(&local_a38,(shared_ptr<Block> *)local_658);
  BPlusTree::InsertKey((BPlusTree *)ctx,6.0,&local_a38);
  std::shared_ptr<Block>::~shared_ptr(&local_a38);
  std::shared_ptr<Block>::shared_ptr(&local_a48,(shared_ptr<Block> *)local_670);
  BPlusTree::InsertKey((BPlusTree *)ctx,7.0,&local_a48);
  std::shared_ptr<Block>::~shared_ptr(&local_a48);
  std::shared_ptr<Block>::shared_ptr(&local_a58,(shared_ptr<Block> *)local_670);
  BPlusTree::InsertKey((BPlusTree *)ctx,8.0,&local_a58);
  std::shared_ptr<Block>::~shared_ptr(&local_a58);
  std::shared_ptr<Block>::shared_ptr(&local_a68,(shared_ptr<Block> *)local_688);
  BPlusTree::InsertKey((BPlusTree *)ctx,9.0,&local_a68);
  std::shared_ptr<Block>::~shared_ptr(&local_a68);
  std::shared_ptr<Block>::shared_ptr(&local_a78,(shared_ptr<Block> *)local_688);
  BPlusTree::InsertKey((BPlusTree *)ctx,10.0,&local_a78);
  std::shared_ptr<Block>::~shared_ptr(&local_a78);
  std::shared_ptr<Block>::shared_ptr(&local_a88,(shared_ptr<Block> *)local_6a0);
  BPlusTree::InsertKey((BPlusTree *)ctx,11.0,&local_a88);
  std::shared_ptr<Block>::~shared_ptr(&local_a88);
  std::shared_ptr<Block>::shared_ptr(&local_a98,(shared_ptr<Block> *)local_6a0);
  BPlusTree::InsertKey((BPlusTree *)ctx,12.0,&local_a98);
  std::shared_ptr<Block>::~shared_ptr(&local_a98);
  std::shared_ptr<Block>::shared_ptr(&local_aa8,(shared_ptr<Block> *)local_6b8);
  BPlusTree::InsertKey((BPlusTree *)ctx,13.0,&local_aa8);
  std::shared_ptr<Block>::~shared_ptr(&local_aa8);
  std::shared_ptr<Block>::shared_ptr(&local_ab8,(shared_ptr<Block> *)local_6b8);
  BPlusTree::InsertKey((BPlusTree *)ctx,14.0,&local_ab8);
  std::shared_ptr<Block>::~shared_ptr(&local_ab8);
  std::shared_ptr<Block>::shared_ptr(&local_ac8,(shared_ptr<Block> *)local_6d0);
  BPlusTree::InsertKey((BPlusTree *)ctx,15.0,&local_ac8);
  std::shared_ptr<Block>::~shared_ptr(&local_ac8);
  std::shared_ptr<Block>::shared_ptr(&local_ad8,(shared_ptr<Block> *)local_6d0);
  BPlusTree::InsertKey((BPlusTree *)ctx,16.0,&local_ad8);
  std::shared_ptr<Block>::~shared_ptr(&local_ad8);
  std::shared_ptr<Block>::shared_ptr(&local_ae8,(shared_ptr<Block> *)local_6e8);
  BPlusTree::InsertKey((BPlusTree *)ctx,17.0,&local_ae8);
  std::shared_ptr<Block>::~shared_ptr(&local_ae8);
  r1.numVotes._3_1_ = 1;
  std::shared_ptr<Block>::~shared_ptr((shared_ptr<Block> *)local_700);
  std::shared_ptr<Block>::~shared_ptr((shared_ptr<Block> *)local_6e8);
  std::shared_ptr<Block>::~shared_ptr((shared_ptr<Block> *)local_6d0);
  std::shared_ptr<Block>::~shared_ptr((shared_ptr<Block> *)local_6b8);
  std::shared_ptr<Block>::~shared_ptr((shared_ptr<Block> *)local_6a0);
  std::shared_ptr<Block>::~shared_ptr((shared_ptr<Block> *)local_688);
  std::shared_ptr<Block>::~shared_ptr((shared_ptr<Block> *)local_670);
  std::shared_ptr<Block>::~shared_ptr((shared_ptr<Block> *)local_658);
  std::shared_ptr<Block>::~shared_ptr((shared_ptr<Block> *)local_640);
  std::shared_ptr<Block>::~shared_ptr((shared_ptr<Block> *)local_628);
  Record::~Record((Record *)local_5f0);
  Record::~Record((Record *)local_5a0);
  Record::~Record((Record *)local_550);
  Record::~Record((Record *)local_500);
  Record::~Record((Record *)local_4b0);
  Record::~Record((Record *)local_460);
  Record::~Record((Record *)local_410);
  Record::~Record((Record *)local_3c0);
  Record::~Record((Record *)local_370);
  Record::~Record((Record *)local_320);
  Record::~Record((Record *)local_2d0);
  Record::~Record((Record *)local_280);
  Record::~Record((Record *)local_230);
  Record::~Record((Record *)local_1e0);
  Record::~Record((Record *)local_190);
  Record::~Record((Record *)local_140);
  Record::~Record((Record *)local_f0);
  Record::~Record((Record *)local_a0);
  Record::~Record((Record *)local_40);
  if ((r1.numVotes._3_1_ & 1) == 0) {
    BPlusTree::~BPlusTree((BPlusTree *)ctx);
  }
  return (int)ctx;
}

Assistant:

BPlusTree init() {
	BPlusTree bplustree(3);
	
	Record r1("r1", 1.00, 1);
	Record r2("r2", 2.00, 2);
	Record r3("r3", 3.00, 3);
	Record r4("r4", 4.00, 4);
	Record r5("r5", 5.00, 5);
	Record r6("r6", 6.00, 6);
	Record r7("r7", 7.00, 7);
	Record r8("r8", 8.00, 8);
	Record r9("r9", 9.00, 9);
	Record r10("r10", 10.00, 10);

	Record r11("r11", 11.00, 11);
	Record r12("r12", 12.00, 12);
	Record r13("r13", 13.00, 13);
	Record r14("r14", 14.00, 14);
	Record r15("r15", 15.00, 15);
	Record r16("r16", 16.00, 16);
	Record r17("r17", 17.00, 17);
	Record r18("r18", 18.00, 18);
	Record r19("r19", 19.00, 19);

	// each block only 2 record
	std::shared_ptr<Block> b1 = std::make_shared<Block>(2);
	// std::cerr << "block address: " << b1 << std::endl;
	std::shared_ptr<Block> b2 = std::make_shared<Block>(2);
	// std::cerr << "block address b2: " << b2 << std::endl;
	std::shared_ptr<Block> b3 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b4 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b5 = std::make_shared<Block>(2);

	std::shared_ptr<Block> b6 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b7 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b8 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b9 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b10 = std::make_shared<Block>(2);

	b1->addRecord(r1);
	b1->addRecord(r2);
    
    b2->addRecord(r3);
	b2->addRecord(r4);

    b3->addRecord(r5);
    b3->addRecord(r6);

	b4->addRecord(r7);
	b4->addRecord(r8);

	b5->addRecord(r9);
	b5->addRecord(r10);

	b6->addRecord(r11);
	b6->addRecord(r12);

	b7->addRecord(r13);
	b7->addRecord(r14);

	b8->addRecord(r15);
	b8->addRecord(r16);

	b9->addRecord(r17);
	b9->addRecord(r18);

	bplustree.InsertKey(1.00, b1);
	bplustree.InsertKey(2.00, b1);

	bplustree.InsertKey(3.00, b2);
    bplustree.InsertKey(4.00, b2);

    bplustree.InsertKey(5.00, b3);
    bplustree.InsertKey(6.00, b3);
 
	bplustree.InsertKey(7.00, b4);
    bplustree.InsertKey(8.00, b4);

	bplustree.InsertKey(9.00, b5);
    bplustree.InsertKey(10.00, b5);

	bplustree.InsertKey(11.00, b6);
	bplustree.InsertKey(12.00, b6);

	bplustree.InsertKey(13.00, b7);
	bplustree.InsertKey(14.00, b7);

	bplustree.InsertKey(15.00, b8);
	bplustree.InsertKey(16.00, b8);

	bplustree.InsertKey(17.00, b9);

	return bplustree;
}